

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O2

TidyOption tidyGetNextOption(TidyDoc tdoc,TidyIterator *pos)

{
  TidyOptionImpl *pTVar1;
  TidyDocImpl *impl;
  
  if (tdoc == (TidyDoc)0x0) {
    if (pos != (TidyIterator *)0x0) {
      *pos = (TidyIterator)0x0;
    }
    return (TidyOption)0x0;
  }
  pTVar1 = prvTidygetNextOption((TidyDocImpl *)tdoc,pos);
  return (TidyOption)pTVar1;
}

Assistant:

TidyOption TIDY_CALL    tidyGetNextOption( TidyDoc tdoc, TidyIterator* pos )
{
    TidyDocImpl* impl = tidyDocToImpl( tdoc );
    const TidyOptionImpl* option = NULL;
    if ( impl )
        option = TY_(getNextOption)( impl, pos );
    else if ( pos )
        *pos = 0;
    return tidyImplToOption( option );
}